

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

fdb_status compactor_set_compaction_interval(filemgr *file,size_t interval)

{
  avl_node *paVar1;
  fdb_status fVar2;
  openfiles_elem_conflict query;
  
  strcpy(query.filename,file->filename);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(&openfiles,&query.avl,_compactor_cmp);
  if (paVar1 == (avl_node *)0x0) {
    fVar2 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    paVar1[1].right = (avl_node *)interval;
    fVar2 = FDB_RESULT_SUCCESS;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return fVar2;
}

Assistant:

fdb_status compactor_set_compaction_interval(struct filemgr *file,
                                             size_t interval)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;
    fdb_status result = FDB_RESULT_SUCCESS;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        elem->interval = interval;
    } else {
        result = FDB_RESULT_INVALID_ARGS;
    }
    mutex_unlock(&cpt_lock);
    return result;
}